

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  Arena **v1;
  Arena **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_50;
  Voidify local_39;
  Arena *local_38;
  Arena *local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  local_30 = MessageLite::GetArena(&lhs->super_MessageLite);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_30);
  local_38 = MessageLite::GetArena((MessageLite *)absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_38);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                       (v1,v2,"lhs->GetArena() == rhs->GetArena()");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x4fd,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  InternalSwap(this,rhs_local,(Message *)absl_log_internal_check_op_result);
  return;
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  InternalSwap(lhs, rhs);
}